

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O1

void __thiscall rcg::Image::Image(Image *this,Buffer *buffer,uint32_t part)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  bool bVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  _Head_base<0UL,_unsigned_char_*,_false> _Var6;
  void *__src;
  GenTLException *pGVar7;
  pointer *__ptr;
  string local_48;
  
  (this->pixel)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  bVar2 = Buffer::getImagePresent(buffer,part);
  if (!bVar2) {
    pGVar7 = (GenTLException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Image::Image(): Now image available.","");
    GenTLException::GenTLException(pGVar7,&local_48);
    __cxa_throw(pGVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
  }
  uVar3 = Buffer::getTimestampNS(buffer);
  this->timestamp = uVar3;
  sVar4 = Buffer::getWidth(buffer,part);
  this->width = sVar4;
  sVar4 = Buffer::getHeight(buffer,part);
  this->height = sVar4;
  sVar4 = Buffer::getXOffset(buffer,part);
  this->xoffset = sVar4;
  sVar4 = Buffer::getYOffset(buffer,part);
  this->yoffset = sVar4;
  sVar4 = Buffer::getXPadding(buffer,part);
  this->xpadding = sVar4;
  sVar4 = Buffer::getYPadding(buffer);
  this->ypadding = sVar4;
  uVar3 = Buffer::getFrameID(buffer);
  this->frameid = uVar3;
  uVar3 = Buffer::getPixelFormat(buffer,part);
  this->pixelformat = uVar3;
  bVar2 = Buffer::isBigEndian(buffer);
  this->bigendian = bVar2;
  sVar4 = Buffer::getSize(buffer,part);
  sVar5 = Buffer::getSizeFilled(buffer);
  if (sVar5 < sVar4) {
    sVar4 = sVar5;
  }
  sVar5 = Buffer::getSizeFilled(buffer);
  if (sVar5 != 0) {
    _Var6._M_head_impl = (uchar *)operator_new__(sVar4);
    _Var1._M_head_impl =
         (this->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->pixel)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    _Var1._M_head_impl =
         (this->pixel)._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    __src = Buffer::getBase(buffer,part);
    memcpy(_Var1._M_head_impl,__src,sVar4);
    return;
  }
  pGVar7 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Image without data","");
  GenTLException::GenTLException(pGVar7,&local_48);
  __cxa_throw(pGVar7,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

Image::Image(const Buffer *buffer, uint32_t part)
{
  if (buffer->getImagePresent(part))
  {
    timestamp=buffer->getTimestampNS();

    width=buffer->getWidth(part);
    height=buffer->getHeight(part);
    xoffset=buffer->getXOffset(part);
    yoffset=buffer->getYOffset(part);
    xpadding=buffer->getXPadding(part);
    ypadding=buffer->getYPadding();
    frameid=buffer->getFrameID();
    pixelformat=buffer->getPixelFormat(part);
    bigendian=buffer->isBigEndian();

    const size_t size=std::min(buffer->getSize(part), buffer->getSizeFilled());

    if (buffer->getSizeFilled() == 0)
    {
      throw GenTLException("Image without data");
    }

    pixel.reset(new uint8_t [size]);

    memcpy(pixel.get(), reinterpret_cast<uint8_t *>(buffer->getBase(part)), size);
  }
  else
  {
    throw GenTLException("Image::Image(): Now image available.");
  }
}